

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# average.hpp
# Opt level: O1

void __thiscall
vista::circular::example::average<double,_4UL>::push(average<double,_4UL> *this,value_type input)

{
  circular_view<double,_4UL> *this_00;
  size_type sVar1;
  reference pdVar2;
  size_type sVar3;
  value_type vVar4;
  
  this_00 = &(this->super_circular_array<double,_4UL>).super_circular_view<double,_4UL>;
  vVar4 = input;
  if ((this->super_circular_array<double,_4UL>).super_circular_view<double,_4UL>.member.size == 4) {
    pdVar2 = circular_view<double,_4UL>::front(this_00);
    vVar4 = input - *pdVar2;
  }
  this->sum = vVar4 + this->sum;
  (this->super_circular_array<double,_4UL>).super_circular_view<double,_4UL>.member.next =
       (ulong)((int)(this->super_circular_array<double,_4UL>).super_circular_view<double,_4UL>.
                    member.next + 1U & 3) | 4;
  sVar1 = (this->super_circular_array<double,_4UL>).super_circular_view<double,_4UL>.member.size;
  sVar3 = sVar1 + 1;
  if (sVar1 == 4) {
    sVar3 = 4;
  }
  (this->super_circular_array<double,_4UL>).super_circular_view<double,_4UL>.member.size = sVar3;
  pdVar2 = circular_view<double,_4UL>::back(this_00);
  *pdVar2 = input;
  return;
}

Assistant:

void push(value_type input) noexcept(std::is_nothrow_move_assignable<value_type>::value)
    {
        // Update the running sum
        if (window::full())
        {
            // Undo the effect of the entry leaving the window
            sum += input - window::front();
        }
        else
        {
            sum += input;
        }
        // Remember the input value for later use
        window::push_back(input);
    }